

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTcParser::create_sym_node(CTcParser *this,textchar_t *sym,size_t sym_len)

{
  CTcPrsDbgSymtab *pCVar1;
  int iVar2;
  CTcSymbol *pCVar3;
  CTcPrsNode *pCVar4;
  undefined *puVar5;
  CTPNSymDebugLocal *this_00;
  textchar_t *siz;
  CTcPrsSymtab *symtab;
  tcprsdbg_sym_info info;
  
  siz = sym;
  pCVar3 = CTcPrsSymtab::find(this->local_symtab_,sym,sym_len,&symtab);
  if ((pCVar3 == (CTcSymbol *)0x0) || (symtab == this->global_symtab_)) {
    pCVar1 = this->debug_symtab_;
    if ((pCVar1 != (CTcPrsDbgSymtab *)0x0) &&
       (siz = sym, iVar2 = (*(code *)**(undefined8 **)pCVar1)(pCVar1,sym,sym_len,&info), iVar2 != 0)
       ) {
      this_00 = (CTPNSymDebugLocal *)
                CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,(size_t)siz);
      CTPNSymDebugLocal::CTPNSymDebugLocal(this_00,&info);
      return (CTcPrsNode *)this_00;
    }
    this->self_referenced_ = 1;
    pCVar4 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,(size_t)siz);
    pCVar4[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)sym;
    pCVar4[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)sym_len;
    puVar5 = &CTPNSym::vtable;
  }
  else {
    pCVar4 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x10,(size_t)siz);
    pCVar4[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar3;
    puVar5 = &CTPNSymResolved::vtable;
  }
  (pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)(puVar5 + 0x10);
  return pCVar4;
}

Assistant:

CTcPrsNode *CTcParser::create_sym_node(const textchar_t *sym, size_t sym_len)
{
    /* 
     *   First, look up the symbol in local scope.  Local scope symbols
     *   can always be resolved during parsing, because the language
     *   requires that local scope items be declared before their first
     *   use. 
     */
    CTcPrsSymtab *symtab;
    CTcSymbol *entry = local_symtab_->find(sym, sym_len, &symtab);

    /* if we found it in local scope, return a resolved symbol node */
    if (entry != 0 && symtab != global_symtab_)
        return new CTPNSymResolved(entry);

    /* if there's a debugger local scope, look it up there */
    if (debug_symtab_ != 0)
    {
        /* look it up in the debug symbol table */
        tcprsdbg_sym_info info;
        if (debug_symtab_->find_symbol(sym, sym_len, &info))
        {
            /* found it - return a debugger local variable */
            return new CTPNSymDebugLocal(&info);
        }
    }

    /* 
     *   We didn't find it in local scope, so the symbol cannot be resolved
     *   until code generation - return an unresolved symbol node.  Note a
     *   possible implicit self-reference, since this could be a property of
     *   'self'.  
     */
    set_self_referenced(TRUE);
    return new CTPNSym(sym, sym_len);
}